

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void RestartModel(CPpmd8 *p)

{
  CPpmd8_Context *pCVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Byte *pBVar5;
  ulong uVar6;
  Byte *pBVar7;
  UInt16 (*paUVar8) [64];
  int iVar9;
  int iVar10;
  CPpmd_State *pCVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  UInt16 (*paUVar15) [64];
  long lVar16;
  
  lVar16 = 0;
  memset(p->FreeList,0,0x130);
  pBVar5 = p->Base;
  uVar3 = p->AlignOffset;
  pBVar7 = pBVar5 + uVar3;
  p->Text = pBVar7;
  uVar4 = p->MaxOrder;
  uVar12 = (ulong)p->Size;
  uVar6 = (ulong)((p->Size / 0x60) * 0x54);
  pCVar11 = (CPpmd_State *)(pBVar7 + (uVar12 - uVar6));
  p->UnitsStart = (Byte *)pCVar11;
  p->LoUnit = (Byte *)pCVar11;
  p->GlueCount = 0;
  p->OrderFall = uVar4;
  uVar14 = 0xc;
  if (uVar4 < 0xc) {
    uVar14 = uVar4;
  }
  p->InitRL = ~uVar14;
  p->RunLength = ~uVar14;
  p->PrevSuccess = 0;
  pCVar1 = (CPpmd8_Context *)(pBVar7 + (uVar12 - 0xc));
  p->HiUnit = (Byte *)pCVar1;
  p->MaxContext = pCVar1;
  p->MinContext = pCVar1;
  pCVar1->Suffix = 0;
  pCVar1->NumStats = 0xff;
  pCVar1->Flags = '\0';
  pCVar1->SummFreq = 0x101;
  p->FoundState = pCVar11;
  p->LoUnit = &pCVar11[0x100].Symbol;
  pCVar1->Stats = (int)pCVar11 - (int)pBVar5;
  pBVar5 = pBVar5 + ((uVar12 + uVar3) - uVar6) + 4;
  do {
    pBVar5[-4] = (Byte)lVar16;
    pBVar5[-3] = '\x01';
    pBVar5[-2] = '\0';
    pBVar5[-1] = '\0';
    pBVar5[0] = '\0';
    pBVar5[1] = '\0';
    lVar16 = lVar16 + 1;
    pBVar5 = pBVar5 + 6;
  } while (lVar16 != 0x100);
  paUVar8 = p->BinSumm;
  uVar12 = 0;
  uVar3 = 0;
  do {
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 + 1;
    } while (uVar12 == p->NS2Indx[uVar4]);
    lVar16 = 0;
    paUVar15 = paUVar8;
    do {
      uVar2 = kInitBinEsc[lVar16];
      uVar6 = 0xfffffffffffffff8;
      do {
        (*paUVar15)[uVar6 + 8] = 0x4000 - (short)((uint)uVar2 / (uVar4 + 1));
        uVar6 = uVar6 + 8;
      } while (uVar6 < 0x38);
      lVar16 = lVar16 + 1;
      paUVar15 = (UInt16 (*) [64])(*paUVar15 + 1);
    } while (lVar16 != 8);
    uVar12 = uVar12 + 1;
    paUVar8 = paUVar8 + 1;
    uVar3 = uVar4;
  } while (uVar12 != 0x19);
  pBVar7 = &p->See[0][0].Count;
  lVar16 = 0;
  iVar9 = 0;
  do {
    iVar10 = iVar9 * 0x10 + 0x18;
    iVar9 = iVar9 + -1;
    do {
      uVar3 = iVar9 + 4;
      iVar10 = iVar10 + 0x10;
      iVar9 = iVar9 + 1;
    } while (lVar16 + 3U == (ulong)p->NS2Indx[uVar3]);
    lVar13 = 0;
    do {
      *(undefined2 *)(pBVar7 + lVar13 * 4 + -1) = 0x703;
      *(short *)(pBVar7 + lVar13 * 4 + -3) = (short)iVar10;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x20);
    lVar16 = lVar16 + 1;
    pBVar7 = pBVar7 + 0x80;
  } while (lVar16 != 0x18);
  return;
}

Assistant:

static void RestartModel(CPpmd7 *p)
{
  unsigned i, k, m;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 256;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = 0; i < 128; i++)
    for (k = 0; k < 8; k++)
    {
      UInt16 *dest = p->BinSumm[i] + k;
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 2));
      for (m = 0; m < 64; m += 8)
        dest[m] = val;
    }
  
  for (i = 0; i < 25; i++)
    for (k = 0; k < 16; k++)
    {
      CPpmd_See *s = &p->See[i][k];
      s->Summ = (UInt16)((5 * i + 10) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 4;
    }
}